

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O3

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  long lVar1;
  float *pfVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar24;
  bool bVar25;
  uint uVar26;
  BxDFFlags BVar27;
  ulong uVar28;
  uint uVar29;
  TransportMode TVar30;
  undefined4 in_register_00000034;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *pTVar31;
  ulong uVar32;
  DielectricInterfaceBxDF *this_00;
  ulong uVar33;
  IdealDiffuseBxDF *pIVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined4 extraout_XMM0_Dc;
  undefined8 in_XMM0_Qb;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar44 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  uint in_XMM1_Db;
  uint in_XMM1_Dd;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 in_ZMM5 [64];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f wo_02;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wo_11;
  Vector3f wo_12;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  Vector3f wi_07;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> rInterface;
  optional<pbrt::BSDFSample> rs;
  optional<pbrt::BSDFSample> wos;
  optional<pbrt::BSDFSample> wis;
  float local_1a0;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_198;
  undefined1 local_188 [16];
  float local_178;
  float fStack_174;
  uint uStack_170;
  uint uStack_16c;
  float local_168;
  uint uStack_164;
  undefined4 uStack_160;
  uint uStack_15c;
  undefined1 local_158 [8];
  float afStack_150 [9];
  bool local_12c;
  undefined1 local_128 [4];
  float afStack_124 [10];
  bool local_fc;
  float local_f8;
  float fStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_e8;
  LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *local_d8;
  float local_d0;
  float local_cc;
  undefined1 local_c8 [8];
  float afStack_c0 [9];
  bool local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  IdealDiffuseBxDF *local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  uStack_160 = 0;
  auVar55._4_60_ = wi._12_60_;
  auVar55._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_188 = auVar55._0_16_;
  local_168 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_178 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_174 = wi.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_170 = (uint)in_XMM2_Qb;
  uStack_16c = (uint)((ulong)in_XMM2_Qb >> 0x20);
  local_f8 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_f4 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_f0 = (uint)in_XMM0_Qb;
  uStack_ec = (uint)((ulong)in_XMM0_Qb >> 0x20);
  if (sampleFlags != All) {
    LogFatal<char_const(&)[39]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.h"
               ,0x330,"Check failed: %s",(char (*) [39])"sampleFlags == BxDFReflTransFlags::All");
  }
  if (((this->config).twoSided != '\0') && (local_168 < 0.0)) {
    local_f8 = -local_f8;
    fStack_f4 = -fStack_f4;
    uStack_f0 = uStack_f0 ^ 0x80000000;
    uStack_ec = uStack_ec ^ 0x80000000;
    local_168 = -local_168;
    in_XMM1_Db = in_XMM1_Db ^ 0x80000000;
    uStack_160 = 0x80000000;
    in_XMM1_Dd = in_XMM1_Dd ^ 0x80000000;
    local_188._0_8_ = CONCAT44(wi._12_4_,auVar55._0_4_) ^ 0x8000000080000000;
    local_188._8_4_ = wi._16_4_ ^ 0x80000000;
    local_188._12_4_ = wi._20_4_ ^ 0x80000000;
    local_178 = -local_178;
    fStack_174 = -fStack_174;
    uStack_170 = uStack_170 ^ 0x80000000;
    uStack_16c = uStack_16c ^ 0x80000000;
  }
  wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_188._0_4_;
  local_cc = wi_00.super_Tuple3<pbrt::Vector3,_float>.z * local_168;
  local_1a0 = 0.0;
  uVar29 = *Options;
  uStack_164 = in_XMM1_Db;
  uStack_15c = in_XMM1_Dd;
  if (0.0 < local_cc) {
    bVar3 = (this->config).nSamples;
    if (local_168 <= 0.0) {
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar35 = vandps_avx512vl(local_188,auVar35);
      wo_09.super_Tuple3<pbrt::Vector3,_float>.z = auVar35._0_4_ * 0.31830987;
    }
    else {
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_f4;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = local_f8;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_174;
      wi_00.super_Tuple3<pbrt::Vector3,_float>.x = local_178;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = local_168;
      wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
           DielectricInterfaceBxDF::PDF(&this->top,wo_00,wi_00,mode,Reflection);
    }
    local_1a0 = wo_09.super_Tuple3<pbrt::Vector3,_float>.z * (float)bVar3 + 0.0;
  }
  wo_09.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  if ((this->config).nSamples != '\0') {
    pIVar34 = &this->bottom;
    uVar28 = CONCAT44(fStack_f4,local_f8) * -0x395b586ca42e166b;
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar35 = vandps_avx512vl(local_188,auVar37);
    uVar32 = CONCAT44(fStack_174,local_178) * -0x395b586ca42e166b;
    uVar28 = (CONCAT44(in_register_00000034,local_168) ^
             ((uVar28 >> 0x2f ^ uVar28) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar33 = (uVar28 >> 0x2f ^ uVar28) * -0x395b586ca42e166b;
    local_98 = ZEXT416((uint)(auVar35._0_4_ * 0.31830987));
    uVar28 = (CONCAT44(0x4fb7dae8,local_188._0_4_) ^
             ((uVar32 >> 0x2f ^ uVar32) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar33 = (uVar29 & 0xffffff ^ uVar33 ^ 0x1a929e4d6f47a654 ^
             (uVar33 >> 0x2f | (ulong)(uVar29 & 0xff000000))) * -0x395b586ca42e166b;
    uVar32 = (uVar28 >> 0x2f ^ uVar28) * -0x395b586ca42e166b;
    uVar28 = (uVar33 >> 0x2f ^ uVar33) * -0x395b586ca42e166b;
    uVar28 = uVar28 >> 0x2f ^ uVar28;
    lVar1 = uVar28 * 2 + 1;
    uVar28 = ((uVar32 >> 0x2f ^ uVar32) + 1) * 0x5851f42d4c957f2d + uVar28 * -0x4f5c17a566d501a4 + 1
    ;
    uVar29 = 0;
    local_d8 = this;
    local_60 = pIVar34;
    do {
      auVar35 = in_ZMM5._0_16_;
      bVar3 = (byte)(uVar28 >> 0x38);
      uVar26 = (uint)(uVar28 >> 0x20);
      if (local_cc <= 0.0) {
        if (local_168 <= 0.0) {
          afStack_150[0] = SUB84(pIVar34,0);
          afStack_150[1] = (float)((ulong)pIVar34 >> 0x20);
          local_158._0_4_ = (anon_struct_4_0_00000001_for___align)0x0;
          local_158._4_4_ = 0;
          local_198.bottom = (IdealDiffuseBxDF *)0x0;
          local_198.top = &this->top;
        }
        else {
          local_158._0_4_ = SUB84(this,0);
          local_158._4_4_ = (undefined4)((ulong)this >> 0x20);
          afStack_150[0] = 0.0;
          afStack_150[1] = 0.0;
          local_198.bottom = pIVar34;
          local_198.top =
               &((LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)0x0)->top;
        }
        uVar26 = uVar26 >> 0xd ^ (uint)(uVar28 >> 0x1b);
        bVar3 = bVar3 >> 3;
        auVar4._4_12_ = in_register_00001384;
        auVar4._0_4_ = in_XMM6_Da;
        auVar37 = vcvtusi2ss_avx512f(auVar4,uVar26 >> bVar3 | uVar26 << 0x20 - bVar3);
        uVar28 = uVar28 * 0x5851f42d4c957f2d + lVar1;
        auVar37 = vminss_avx(ZEXT416((uint)(auVar37._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        uVar32 = uVar28 * 0x5851f42d4c957f2d + lVar1;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar28;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar32;
        auVar40 = vpunpcklqdq_avx(auVar42,auVar49);
        auVar36 = vpsrlvq_avx2(auVar40,_DAT_003ea520);
        auVar4 = vpsrlvq_avx2(auVar40,_DAT_003ea530);
        auVar40 = vpsrlq_avx(auVar40,0x3b);
        auVar40 = vpshufd_avx(auVar40,0xe8);
        uVar28 = uVar32 * 0x5851f42d4c957f2d + lVar1;
        auVar36 = vpshufd_avx(auVar36 ^ auVar4,0xe8);
        auVar40 = vprorvd_avx512vl(auVar36,auVar40);
        auVar36 = vcvtudq2ps_avx512vl(auVar40);
        auVar40._8_4_ = 0x2f800000;
        auVar40._0_8_ = 0x2f8000002f800000;
        auVar40._12_4_ = 0x2f800000;
        auVar40 = vmulps_avx512vl(auVar36,auVar40);
        auVar36._8_4_ = 0x3f7fffff;
        auVar36._0_8_ = 0x3f7fffff3f7fffff;
        auVar36._12_4_ = 0x3f7fffff;
        auVar40 = vminps_avx512vl(auVar40,auVar36);
        wo_03.super_Tuple3<pbrt::Vector3,_float>.y = fStack_f4;
        wo_03.super_Tuple3<pbrt::Vector3,_float>.x = local_f8;
        in_ZMM5 = ZEXT1664(auVar35);
        wo_03.super_Tuple3<pbrt::Vector3,_float>.z = local_168;
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  ((optional<pbrt::BSDFSample> *)local_128,
                   (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                   local_158,wo_03,auVar37._0_4_,(Point2f)auVar40._0_8_,mode,All);
        if (local_fc == true) {
          if (((float)local_128 == 0.0) && (!NAN((float)local_128))) {
            uVar32 = 0xffffffffffffffff;
            do {
              if (uVar32 == 2) goto LAB_0039db33;
              lVar24 = uVar32 + 1;
              uVar32 = uVar32 + 1;
            } while ((afStack_124[lVar24] == 0.0) && (!NAN(afStack_124[lVar24])));
            if (2 < uVar32) goto LAB_0039db33;
          }
          if ((((afStack_124[6] != 0.0) || (NAN(afStack_124[6]))) &&
              ((afStack_124[5] != 0.0 || (NAN(afStack_124[5]))))) &&
             (((uint)afStack_124[7] & 1) == 0)) {
            uVar26 = (uint)(uVar28 >> 0x2d) ^ (uint)(uVar28 >> 0x1b);
            bVar3 = (byte)(uVar28 >> 0x3b);
            auVar20._4_12_ = in_register_00001384;
            auVar20._0_4_ = in_XMM6_Da;
            auVar35 = vcvtusi2ss_avx512f(auVar20,uVar26 >> bVar3 | uVar26 << 0x20 - bVar3);
            uVar28 = uVar28 * 0x5851f42d4c957f2d + lVar1;
            auVar35 = vminss_avx(ZEXT416((uint)(auVar35._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            uVar32 = uVar28 * 0x5851f42d4c957f2d + lVar1;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar28;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar32;
            auVar37 = vpunpcklqdq_avx(auVar43,auVar50);
            auVar40 = vpsrlvq_avx2(auVar37,_DAT_003ea520);
            auVar36 = vpsrlvq_avx2(auVar37,_DAT_003ea530);
            auVar37 = vpsrlq_avx(auVar37,0x3b);
            auVar37 = vpshufd_avx(auVar37,0xe8);
            auVar40 = vpshufd_avx(auVar40 ^ auVar36,0xe8);
            auVar37 = vprorvd_avx512vl(auVar40,auVar37);
            auVar37 = vcvtudq2ps_avx512vl(auVar37);
            auVar14._8_4_ = 0x2f800000;
            auVar14._0_8_ = 0x2f8000002f800000;
            auVar14._12_4_ = 0x2f800000;
            auVar37 = vmulps_avx512vl(auVar37,auVar14);
            auVar15._8_4_ = 0x3f7fffff;
            auVar15._0_8_ = 0x3f7fffff3f7fffff;
            auVar15._12_4_ = 0x3f7fffff;
            auVar37 = vminps_avx512vl(auVar37,auVar15);
            wo_04.super_Tuple3<pbrt::Vector3,_float>.y = fStack_174;
            wo_04.super_Tuple3<pbrt::Vector3,_float>.x = local_178;
            pTVar31 = &local_198;
            wo_04.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_188._0_4_;
            TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                      ((optional<pbrt::BSDFSample> *)local_c8,pTVar31,wo_04,auVar35._0_4_,
                       (Point2f)auVar37._0_8_,(uint)(mode == Radiance),All);
            TVar30 = (TransportMode)pTVar31;
            if (local_9c == true) {
              if (local_fc != true) goto LAB_0039db9c;
              if (((float)local_128 != 0.0) || (NAN((float)local_128))) {
                bVar25 = false;
              }
              else {
                uVar28 = 0;
                while (uVar33 = uVar28, uVar33 != 3) {
                  if ((*(float *)(local_128 + uVar33 * 4 + 4) != 0.0) ||
                     (uVar28 = uVar33 + 1, NAN(*(float *)(local_128 + uVar33 * 4 + 4)))) break;
                }
                bVar25 = 2 < uVar33;
              }
              if ((((!bVar25) && ((afStack_124[6] != 0.0 || (NAN(afStack_124[6]))))) &&
                  ((afStack_124[5] != 0.0 || (NAN(afStack_124[5]))))) &&
                 (((uint)afStack_c0[6] & 1) == 0)) {
                BVar27 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                         Flags((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                *)local_158);
                if ((BVar27 & Specular) == Unset) {
                  BVar27 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                           Flags(&local_198);
                  if ((BVar27 & Specular) == Unset) {
                    if (local_9c == false) {
LAB_0039db9c:
                      LogFatal<char_const(&)[4]>
                                (Fatal,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                 ,0xea,"Check failed: %s",(char (*) [4])0x280907c);
                    }
                    wi_03.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_c0[4];
                    if ((DielectricInterfaceBxDF *)CONCAT44(local_158._4_4_,local_158._0_4_) ==
                        (DielectricInterfaceBxDF *)0x0) {
                      auVar16._8_4_ = 0x7fffffff;
                      auVar16._0_8_ = 0x7fffffff7fffffff;
                      auVar16._12_4_ = 0x7fffffff;
                      auVar35 = vandps_avx512vl(ZEXT416((uint)afStack_c0[4]),auVar16);
                      uVar5 = vcmpss_avx512f(ZEXT416((uint)(wi_03.super_Tuple3<pbrt::Vector3,_float>
                                                            .z * local_168)),ZEXT416(0),0xe);
                      local_88 = ZEXT416((uint)((byte)uVar5 & 1) * (int)(auVar35._0_4_ * 0.31830987)
                                        );
                    }
                    else {
                      wi_03.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                           CONCAT44(afStack_c0[3],afStack_c0[2]) ^ 0x8000000080000000;
                      wo_08.super_Tuple3<pbrt::Vector3,_float>.y = fStack_f4;
                      wo_08.super_Tuple3<pbrt::Vector3,_float>.x = local_f8;
                      wo_08.super_Tuple3<pbrt::Vector3,_float>.z = local_168;
                      local_88._0_4_ =
                           DielectricInterfaceBxDF::PDF
                                     ((DielectricInterfaceBxDF *)
                                      CONCAT44(local_158._4_4_,local_158._0_4_),wo_08,wi_03,TVar30,
                                      All);
                      local_88._4_4_ = extraout_XMM0_Db;
                      local_88._8_4_ = extraout_XMM0_Dc;
                      local_88._12_4_ = extraout_XMM0_Dd;
                    }
                    if (local_fc != true) goto LAB_0039db9c;
                    wo_12.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_124[5];
                    if (local_198.top == (DielectricInterfaceBxDF *)0x0) {
                      uVar5 = vcmpss_avx512f(ZEXT416((uint)(wo_12.super_Tuple3<pbrt::Vector3,_float>
                                                            .z * (float)local_188._0_4_)),ZEXT416(0)
                                             ,0xe);
                      wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                           (float)((uint)((byte)uVar5 & 1) * local_98._0_4_);
                    }
                    else {
                      wo_12.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                           CONCAT44(afStack_124[4],afStack_124[3]) ^ 0x8000000080000000;
                      wi_07.super_Tuple3<pbrt::Vector3,_float>.y = fStack_174;
                      wi_07.super_Tuple3<pbrt::Vector3,_float>.x = local_178;
                      wi_07.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_188._0_4_;
                      wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                           DielectricInterfaceBxDF::PDF(local_198.top,wo_12,wi_07,TVar30,All);
                    }
                    wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                         (wo_09.super_Tuple3<pbrt::Vector3,_float>.z + (float)local_88._0_4_) * 0.5;
                    goto LAB_0039db12;
                  }
                  if (local_9c == false) goto LAB_0039db9c;
                  if ((DielectricInterfaceBxDF *)CONCAT44(local_158._4_4_,local_158._0_4_) ==
                      (DielectricInterfaceBxDF *)0x0) {
                    auVar17._8_4_ = 0x7fffffff;
                    auVar17._0_8_ = 0x7fffffff7fffffff;
                    auVar17._12_4_ = 0x7fffffff;
                    auVar35 = vandps_avx512vl(ZEXT416((uint)afStack_c0[4]),auVar17);
                    wo_09.super_Tuple3<pbrt::Vector3,_float>.z = auVar35._0_4_ * 0.31830987;
                    uVar5 = vcmpss_avx512f(ZEXT416((uint)(-afStack_c0[4] * local_168)),ZEXT416(0),
                                           0xe);
                    bVar3 = (byte)uVar5;
                    goto LAB_0039d8d0;
                  }
                  auVar53._0_8_ = CONCAT44(afStack_c0[3],afStack_c0[2]) ^ 0x8000000080000000;
                  auVar53._8_4_ = 0x80000000;
                  auVar53._12_4_ = 0x80000000;
                  auVar44._4_4_ = fStack_f4;
                  auVar44._0_4_ = local_f8;
                  auVar44._8_4_ = uStack_f0;
                  auVar44._12_4_ = uStack_ec;
                  this_00 = (DielectricInterfaceBxDF *)CONCAT44(local_158._4_4_,local_158._0_4_);
                  wo_09.super_Tuple3<pbrt::Vector3,_float>.z = local_168;
                  fVar21 = -afStack_c0[4];
                }
                else {
                  if (local_fc != true) goto LAB_0039db9c;
                  wo_09.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_124[5];
                  if (local_198.top == (DielectricInterfaceBxDF *)0x0) goto LAB_0039d8b6;
                  auVar44._0_8_ = CONCAT44(afStack_124[4],afStack_124[3]) ^ 0x8000000080000000;
                  auVar44._8_4_ = 0x80000000;
                  auVar44._12_4_ = 0x80000000;
                  auVar53._4_4_ = fStack_174;
                  auVar53._0_4_ = local_178;
                  auVar53._8_4_ = uStack_170;
                  auVar53._12_4_ = uStack_16c;
                  this_00 = local_198.top;
                  fVar21 = (float)local_188._0_4_;
                }
                wo_11.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar44._0_8_;
                wo_11.super_Tuple3<pbrt::Vector3,_float>.z =
                     wo_09.super_Tuple3<pbrt::Vector3,_float>.z;
                wi_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar53._0_8_;
                wi_06.super_Tuple3<pbrt::Vector3,_float>.z = fVar21;
                wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                     DielectricInterfaceBxDF::PDF(this_00,wo_11,wi_06,TVar30,All);
LAB_0039db12:
                local_1a0 = local_1a0 + wo_09.super_Tuple3<pbrt::Vector3,_float>.z;
              }
            }
LAB_0039db22:
            uVar28 = uVar32 * 0x5851f42d4c957f2d + lVar1;
          }
        }
      }
      else {
        local_e8.bottom = SUB168(ZEXT816(0),4);
        if (local_168 <= 0.0) {
          local_198.bottom = (IdealDiffuseBxDF *)0x0;
          local_198.top = &this->top;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = pIVar34;
          local_e8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                     (auVar23 << 0x40);
        }
        else {
          auVar22._8_8_ = 0;
          auVar22._0_8_ = pIVar34;
          local_198 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>)
                      (auVar22 << 0x40);
          local_e8.top = &this->top;
        }
        uVar26 = uVar26 >> 0xd ^ (uint)(uVar28 >> 0x1b);
        bVar3 = bVar3 >> 3;
        auVar18._4_12_ = in_register_00001384;
        auVar18._0_4_ = in_XMM6_Da;
        auVar37 = vcvtusi2ss_avx512f(auVar18,uVar26 >> bVar3 | uVar26 << 0x20 - bVar3);
        uVar28 = uVar28 * 0x5851f42d4c957f2d + lVar1;
        auVar37 = vminss_avx(ZEXT416((uint)(auVar37._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        uVar32 = uVar28 * 0x5851f42d4c957f2d + lVar1;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = uVar28;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar32;
        auVar40 = vpunpcklqdq_avx(auVar39,auVar47);
        auVar36 = vpsrlvq_avx2(auVar40,_DAT_003ea520);
        auVar4 = vpsrlvq_avx2(auVar40,_DAT_003ea530);
        auVar40 = vpsrlq_avx(auVar40,0x3b);
        auVar40 = vpshufd_avx(auVar40,0xe8);
        auVar36 = vpshufd_avx(auVar36 ^ auVar4,0xe8);
        auVar40 = vprorvd_avx512vl(auVar36,auVar40);
        auVar40 = vcvtudq2ps_avx512vl(auVar40);
        auVar6._8_4_ = 0x2f800000;
        auVar6._0_8_ = 0x2f8000002f800000;
        auVar6._12_4_ = 0x2f800000;
        auVar40 = vmulps_avx512vl(auVar40,auVar6);
        auVar7._8_4_ = 0x3f7fffff;
        auVar7._0_8_ = 0x3f7fffff3f7fffff;
        auVar7._12_4_ = 0x3f7fffff;
        auVar40 = vminps_avx512vl(auVar40,auVar7);
        wo_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_f4;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.x = local_f8;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_168;
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  ((optional<pbrt::BSDFSample> *)local_158,&local_e8,wo_01,auVar37._0_4_,
                   (Point2f)auVar40._0_8_,mode,Transmission);
        bVar25 = local_12c;
        if (local_12c == true) {
          _local_128 = CONCAT44(local_158._4_4_,local_158._0_4_);
          afStack_124[7] = afStack_150[6];
          afStack_124[8] = afStack_150[7];
          afStack_124[9] = afStack_150[8];
          afStack_124[1] = afStack_150[0];
          afStack_124[2] = afStack_150[1];
          afStack_124[3] = afStack_150[2];
          afStack_124[4] = afStack_150[3];
          afStack_124[5] = afStack_150[4];
          afStack_124[6] = afStack_150[5];
          local_fc = true;
        }
        uVar28 = uVar32 * 0x5851f42d4c957f2d + lVar1;
        uVar26 = (uint)(uVar28 >> 0x2d) ^ (uint)(uVar28 >> 0x1b);
        bVar3 = (byte)(uVar28 >> 0x3b);
        auVar19._4_12_ = in_register_00001384;
        auVar19._0_4_ = in_XMM6_Da;
        auVar37 = vcvtusi2ss_avx512f(auVar19,uVar26 >> bVar3 | uVar26 << 0x20 - bVar3);
        uVar28 = uVar28 * 0x5851f42d4c957f2d + lVar1;
        auVar37 = vminss_avx(ZEXT416((uint)(auVar37._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
        uVar32 = uVar28 * 0x5851f42d4c957f2d + lVar1;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar28;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = uVar32;
        auVar40 = vpunpcklqdq_avx(auVar41,auVar48);
        auVar36 = vpsrlvq_avx2(auVar40,_DAT_003ea520);
        auVar4 = vpsrlvq_avx2(auVar40,_DAT_003ea530);
        auVar40 = vpsrlq_avx(auVar40,0x3b);
        auVar40 = vpshufd_avx(auVar40,0xe8);
        auVar36 = vpshufd_avx(auVar36 ^ auVar4,0xe8);
        auVar40 = vprorvd_avx512vl(auVar36,auVar40);
        auVar40 = vcvtudq2ps_avx512vl(auVar40);
        auVar8._8_4_ = 0x2f800000;
        auVar8._0_8_ = 0x2f8000002f800000;
        auVar8._12_4_ = 0x2f800000;
        auVar40 = vmulps_avx512vl(auVar40,auVar8);
        auVar9._8_4_ = 0x3f7fffff;
        auVar9._0_8_ = 0x3f7fffff3f7fffff;
        auVar9._12_4_ = 0x3f7fffff;
        auVar40 = vminps_avx512vl(auVar40,auVar9);
        wo_02.super_Tuple3<pbrt::Vector3,_float>.y = fStack_174;
        wo_02.super_Tuple3<pbrt::Vector3,_float>.x = local_178;
        pTVar31 = &local_e8;
        in_ZMM5 = ZEXT1664(auVar35);
        wo_02.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_188._0_4_;
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  ((optional<pbrt::BSDFSample> *)local_158,pTVar31,wo_02,auVar37._0_4_,
                   (Point2f)auVar40._0_8_,(uint)(mode == Radiance),Transmission);
        pIVar34 = local_60;
        this = local_d8;
        TVar30 = (TransportMode)pTVar31;
        if (local_12c == true) {
          local_c8 = (undefined1  [8])CONCAT44(local_158._4_4_,local_158._0_4_);
          afStack_c0[6] = afStack_150[6];
          afStack_c0[7] = afStack_150[7];
          afStack_c0[8] = afStack_150[8];
          afStack_c0[0] = afStack_150[0];
          afStack_c0[1] = afStack_150[1];
          afStack_c0[2] = afStack_150[2];
          afStack_c0[3] = afStack_150[3];
          afStack_c0[4] = afStack_150[4];
          afStack_c0[5] = afStack_150[5];
        }
        uVar28 = uVar32 * 0x5851f42d4c957f2d + lVar1;
        if (bVar25 != false) {
          if (((float)local_128 != 0.0) || (NAN((float)local_128))) {
            bVar25 = false;
          }
          else {
            uVar32 = 0;
            while (uVar33 = uVar32, uVar33 != 3) {
              if ((*(float *)(local_128 + uVar33 * 4 + 4) != 0.0) ||
                 (uVar32 = uVar33 + 1, NAN(*(float *)(local_128 + uVar33 * 4 + 4)))) break;
            }
            bVar25 = 2 < uVar33;
          }
          if ((local_12c == true && !bVar25) && 0.0 < afStack_124[6]) {
            if (((float)local_c8._0_4_ == 0.0) && (!NAN((float)local_c8._0_4_))) {
              uVar32 = 0xffffffffffffffff;
              do {
                if (uVar32 == 2) goto LAB_0039db33;
                pfVar2 = afStack_c0 + uVar32;
                uVar32 = uVar32 + 1;
              } while ((*pfVar2 == 0.0) && (!NAN(*pfVar2)));
              if (2 < uVar32) goto LAB_0039db33;
            }
            local_88._0_4_ = afStack_c0[5];
            if (0.0 < afStack_c0[5]) {
              in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
              bVar25 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                       IsNonSpecular(&local_e8);
              if (bVar25) {
                uVar26 = (uint)(uVar28 >> 0x2d) ^ (uint)(uVar28 >> 0x1b);
                bVar3 = (byte)(uVar28 >> 0x3b);
                uVar28 = uVar28 * 0x5851f42d4c957f2d + lVar1;
                uVar32 = uVar28 * 0x5851f42d4c957f2d + lVar1;
                local_48._0_8_ = CONCAT44(afStack_124[4],afStack_124[3]) ^ 0x8000000080000000;
                local_48._8_4_ = 0x80000000;
                local_48._12_4_ = 0x80000000;
                local_78 = ZEXT416((uint)afStack_124[5]);
                wo_05.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_124[5];
                auVar35 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,uVar26 >> bVar3 | uVar26 << 0x20 - bVar3
                                            );
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar28;
                auVar56._8_8_ = 0;
                auVar56._0_8_ = uVar32;
                auVar40 = vpunpcklqdq_avx(auVar54,auVar56);
                auVar37 = vpsrlvq_avx2(auVar40,_DAT_003ea520);
                auVar36 = vpsrlvq_avx2(auVar40,_DAT_003ea530);
                auVar35 = vminss_avx(ZEXT416((uint)(auVar35._0_4_ * 2.3283064e-10)),
                                     ZEXT416(0x3f7fffff));
                auVar37 = vpshufd_avx(auVar37 ^ auVar36,0xe8);
                in_ZMM5 = ZEXT1664(auVar37);
                auVar40 = vpsrlq_avx(auVar40,0x3b);
                auVar40 = vpshufd_avx(auVar40,0xe8);
                auVar37 = vprorvd_avx512vl(auVar37,auVar40);
                auVar37 = vcvtudq2ps_avx512vl(auVar37);
                auVar10._8_4_ = 0x2f800000;
                auVar10._0_8_ = 0x2f8000002f800000;
                auVar10._12_4_ = 0x2f800000;
                auVar37 = vmulps_avx512vl(auVar37,auVar10);
                auVar11._8_4_ = 0x3f7fffff;
                auVar11._0_8_ = 0x3f7fffff3f7fffff;
                auVar11._12_4_ = 0x3f7fffff;
                auVar37 = vminps_avx512vl(auVar37,auVar11);
                pTVar31 = &local_198;
                uStack_54 = 0x80000000;
                uStack_50 = 0x80000000;
                uStack_4c = 0x80000000;
                wo_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_48._0_8_;
                wo_05.super_Tuple3<pbrt::Vector3,_float>.y =
                     (float)(int)((ulong)local_48._0_8_ >> 0x20);
                local_58 = wo_05.super_Tuple3<pbrt::Vector3,_float>.z;
                TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                          ((optional<pbrt::BSDFSample> *)local_158,pTVar31,wo_05,auVar35._0_4_,
                           (Point2f)auVar37._0_8_,mode,All);
                TVar30 = (TransportMode)pTVar31;
                if (local_12c == true) {
                  if (((float)local_158._0_4_ == 0.0) && (!NAN((float)local_158._0_4_))) {
                    uVar28 = 0xffffffffffffffff;
                    do {
                      if (uVar28 == 2) goto LAB_0039db22;
                      pfVar2 = afStack_150 + uVar28;
                      uVar28 = uVar28 + 1;
                    } while ((*pfVar2 == 0.0) && (!NAN(*pfVar2)));
                    if (2 < uVar28) goto LAB_0039db22;
                  }
                  if ((afStack_150[5] != 0.0) || (NAN(afStack_150[5]))) {
                    bVar25 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                             ::IsNonSpecular(&local_198);
                    if (!bVar25) {
                      if (local_12c == false) {
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x280907c);
                      }
                      wo_09.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_150[4];
                      if (local_e8.top == (DielectricInterfaceBxDF *)0x0) {
LAB_0039d8b6:
                        uVar5 = vcmpss_avx512f(ZEXT416((uint)(wo_09.
                                                  super_Tuple3<pbrt::Vector3,_float>.z *
                                                  (float)local_188._0_4_)),ZEXT416(0),0xe);
                        bVar3 = (byte)uVar5;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_98._0_4_;
LAB_0039d8d0:
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                             (float)((uint)(bVar3 & 1) *
                                    (int)wo_09.super_Tuple3<pbrt::Vector3,_float>.z);
                      }
                      else {
                        wo_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             CONCAT44(afStack_150[3],afStack_150[2]) ^ 0x8000000080000000;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.y = fStack_174;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.x = local_178;
                        wi_04.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_188._0_4_;
                        wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                             DielectricInterfaceBxDF::PDF(local_e8.top,wo_09,wi_04,TVar30,All);
                      }
                      goto LAB_0039db12;
                    }
                    if (local_12c == false) {
                      LogFatal<char_const(&)[4]>
                                (Fatal,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                 ,0xea,"Check failed: %s",(char (*) [4])0x280907c);
                    }
                    wo_06.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_150[4];
                    if (local_e8.top == (DielectricInterfaceBxDF *)0x0) {
                      uVar5 = vcmpss_avx512f(ZEXT416((uint)(wo_06.super_Tuple3<pbrt::Vector3,_float>
                                                            .z * (float)local_188._0_4_)),ZEXT416(0)
                                             ,0xe);
                      auVar38._4_12_ = local_98._4_12_;
                      auVar38._0_4_ = (uint)((byte)uVar5 & 1) * local_98._0_4_;
                    }
                    else {
                      wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                           CONCAT44(afStack_150[3],afStack_150[2]) ^ 0x8000000080000000;
                      wi_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_174;
                      wi_01.super_Tuple3<pbrt::Vector3,_float>.x = local_178;
                      wi_01.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_188._0_4_;
                      auVar45._0_4_ =
                           DielectricInterfaceBxDF::PDF(local_e8.top,wo_06,wi_01,TVar30,All);
                      auVar45._4_60_ = extraout_var;
                      auVar38 = auVar45._0_16_;
                    }
                    auVar35 = local_48;
                    if ((local_12c & 1U) == 0) {
                      LogFatal<char_const(&)[4]>
                                (Fatal,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                 ,0xea,"Check failed: %s",(char (*) [4])0x280907c);
                    }
                    if (local_198.top == (DielectricInterfaceBxDF *)0x0) {
                      auVar12._8_4_ = 0x7fffffff;
                      auVar12._0_8_ = 0x7fffffff7fffffff;
                      auVar12._12_4_ = 0x7fffffff;
                      auVar35 = vandps_avx512vl(ZEXT416((uint)afStack_c0[4]),auVar12);
                      uVar5 = vcmpss_avx512f(ZEXT416((uint)(afStack_c0[4] * (float)local_78._0_4_)),
                                             ZEXT416(0),0xe);
                      auVar35 = ZEXT416((uint)((byte)uVar5 & 1) * (int)(auVar35._0_4_ * 0.31830987))
                      ;
                      wo_09.super_Tuple3<pbrt::Vector3,_float>.z = afStack_150[5];
                    }
                    else {
                      local_d0 = afStack_150[5];
                      wi_05.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                           CONCAT44(afStack_c0[3],afStack_c0[2]) ^ 0x8000000080000000;
                      wi_05.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_c0[4];
                      wo_10.super_Tuple3<pbrt::Vector3,_float>.z = local_58;
                      wo_10.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_48._0_4_;
                      wo_10.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_48._4_4_;
                      local_78 = auVar38;
                      local_48 = auVar35;
                      auVar46._0_4_ =
                           DielectricInterfaceBxDF::PDF(local_198.top,wo_10,wi_05,TVar30,All);
                      auVar46._4_60_ = extraout_var_00;
                      auVar35 = auVar46._0_16_;
                      wo_09.super_Tuple3<pbrt::Vector3,_float>.z = local_d0;
                      auVar38 = local_78;
                    }
                    auVar51._0_4_ =
                         (wo_09.super_Tuple3<pbrt::Vector3,_float>.z *
                         wo_09.super_Tuple3<pbrt::Vector3,_float>.z) /
                         (auVar38._0_4_ * auVar38._0_4_ +
                         wo_09.super_Tuple3<pbrt::Vector3,_float>.z *
                         wo_09.super_Tuple3<pbrt::Vector3,_float>.z);
                    auVar51._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    auVar37 = vfmadd213ss_fma(auVar51,auVar38,ZEXT416((uint)local_1a0));
                    auVar52._0_4_ =
                         ((float)local_88._0_4_ * (float)local_88._0_4_) /
                         ((float)local_88._0_4_ * (float)local_88._0_4_ +
                         auVar35._0_4_ * auVar35._0_4_);
                    auVar52._4_12_ = SUB6012((undefined1  [60])0x0,0);
                    auVar35 = vfmadd213ss_fma(auVar52,auVar35,auVar37);
                    local_1a0 = auVar35._0_4_;
                  }
                }
                goto LAB_0039db22;
              }
              if (local_198.top == (DielectricInterfaceBxDF *)0x0) {
                auVar13._8_4_ = 0x7fffffff;
                auVar13._0_8_ = 0x7fffffff7fffffff;
                auVar13._12_4_ = 0x7fffffff;
                auVar35 = vandps_avx512vl(ZEXT416((uint)afStack_c0[4]),auVar13);
                uVar5 = vcmpss_avx512f(ZEXT416((uint)(afStack_124[5] * afStack_c0[4])),ZEXT416(0),
                                       0xe);
                wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                     (float)((uint)((byte)uVar5 & 1) * (int)(auVar35._0_4_ * 0.31830987));
              }
              else {
                wi_02.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_c0[4];
                wo_07.super_Tuple3<pbrt::Vector3,_float>.z = -afStack_124[5];
                wo_07.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                     CONCAT44(afStack_124[4],afStack_124[3]) ^ 0x8000000080000000;
                wi_02.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                     CONCAT44(afStack_c0[3],afStack_c0[2]) ^ 0x8000000080000000;
                wo_09.super_Tuple3<pbrt::Vector3,_float>.z =
                     DielectricInterfaceBxDF::PDF(local_198.top,wo_07,wi_02,TVar30,All);
              }
              local_1a0 = local_1a0 + wo_09.super_Tuple3<pbrt::Vector3,_float>.z;
            }
          }
        }
      }
LAB_0039db33:
      bVar3 = (this->config).nSamples;
      uVar29 = uVar29 + 1;
    } while (uVar29 < bVar3);
    wo_09.super_Tuple3<pbrt::Vector3,_float>.z = (float)bVar3;
  }
  return (local_1a0 / wo_09.super_Tuple3<pbrt::Vector3,_float>.z) * 0.9 + 0.007957749;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Return approximate PDF for layered BSDF
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        // Update _pdfSum_ for reflection at the entrance layer
        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        if (SameHemisphere(wo, wi)) {
            auto reflFlag = BxDFReflTransFlags::Reflection;
            pdfSum += enteredTop ? config.nSamples * top.PDF(wo, wi, mode, reflFlag)
                                 : config.nSamples * bottom.PDF(wo, wi, mode, reflFlag);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                auto trans = BxDFReflTransFlags::Transmission;
                pstd::optional<BSDFSample> wos, wis;
                wos = tInterface.Sample_f(wo, r(), {r(), r()}, mode, trans);
                wis = tInterface.Sample_f(wi, r(), {r(), r()}, !mode, trans);

                // Update _pdfSum_ accounting for TRT scattering events
                if (wos && wos->f && wos->pdf > 0 && wis && wis->f && wis->pdf > 0) {
                    if (!tInterface.IsNonSpecular())
                        pdfSum += rInterface.PDF(-wos->wi, -wis->wi, mode);
                    else {
                        // Use multiple importance sampling to estimate PDF product
                        pstd::optional<BSDFSample> rs =
                            rInterface.Sample_f(-wos->wi, r(), {r(), r()}, mode);
                        if (!rs || !rs->f || rs->pdf == 0)
                            ;
                        else if (!rInterface.IsNonSpecular())
                            pdfSum += tInterface.PDF(-rs->wi, wi, mode);
                        else {
                            // Actual MIS here
                            // first, sample r -> r cancels
                            Float tPDF = tInterface.PDF(-rs->wi, wi, mode);
                            Float wt = PowerHeuristic(1, rs->pdf, 1, tPDF);
                            pdfSum += wt * tPDF;

                            Float rPDF = rInterface.PDF(-wos->wi, -wis->wi, mode);
                            wt = PowerHeuristic(1, wis->pdf, 1, rPDF);
                            pdfSum += wt * rPDF;
                        }
                    }
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                pstd::optional<BSDFSample> wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0 ||
                    wos->IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                pstd::optional<BSDFSample> wis = tiInterface.Sample_f(wi, uc, u, !mode);
                if (!wis || !wos->f || wos->pdf == 0 || wos->wi.z == 0 ||
                    wis->IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos->wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis->wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis->wi, mode) +
                               tiInterface.PDF(-wos->wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(0.9f, 1 / (4 * Pi), pdfSum / config.nSamples);
    }